

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditor::SortImages(CEditor *this)

{
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *other;
  CEditorImage **ppCVar1;
  CEditorImage *pCVar2;
  int *piVar3;
  int iVar4;
  CEditorImage **__buffer;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  pair<CEditorImage_**,_long> pVar8;
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> lTemp;
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (1 < (this->m_Map).m_lImages.num_elements) {
    other = &(this->m_Map).m_lImages;
    lVar7 = 1;
    do {
      iVar4 = str_comp(other->list[lVar7]->m_aName,other->list[lVar7 + -1]->m_aName);
      if (iVar4 < 0) {
        array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::array(&local_48,other);
        uVar5 = 0xffffffffffffffff;
        if (-1 < (long)local_48.num_elements) {
          uVar5 = (long)local_48.num_elements * 4;
        }
        gs_pSortedIndex = (int *)operator_new__(uVar5);
        lVar7 = (long)(this->m_Map).m_lImages.num_elements;
        if (lVar7 != 0) {
          ppCVar1 = (this->m_Map).m_lImages.list;
          pVar8 = std::get_temporary_buffer<CEditorImage*>
                            ((long)(int)((lVar7 - (lVar7 + 1 >> 0x3f)) + 1U >> 1));
          lVar6 = pVar8.second;
          __buffer = pVar8.first;
          if (__buffer == (CEditorImage **)0x0) {
            std::
            __inplace_stable_sort<CEditorImage**,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(CEditorImage_const*,CEditorImage_const*)>>
                      (ppCVar1,ppCVar1 + lVar7,
                       (_Iter_comp_iter<int_(*)(const_CEditorImage_*,_const_CEditorImage_*)>)
                       0x19c7ad);
            lVar6 = 0;
          }
          else {
            std::
            __stable_sort_adaptive<CEditorImage**,CEditorImage**,long,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(CEditorImage_const*,CEditorImage_const*)>>
                      (ppCVar1,ppCVar1 + lVar7,__buffer,lVar6,
                       (_Iter_comp_iter<int_(*)(const_CEditorImage_*,_const_CEditorImage_*)>)
                       0x19c7ad);
          }
          operator_delete(__buffer,lVar6 << 3);
        }
        piVar3 = gs_pSortedIndex;
        if (0 < local_48.num_elements) {
          ppCVar1 = other->list;
          lVar7 = 0;
          do {
            if (0 < (this->m_Map).m_lImages.num_elements) {
              pCVar2 = local_48.list[lVar7];
              lVar6 = 0;
              do {
                if (pCVar2 == ppCVar1[lVar6]) {
                  piVar3[lVar7] = (int)lVar6;
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < (this->m_Map).m_lImages.num_elements);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < local_48.num_elements);
        }
        CEditorMap::ModifyImageIndex(&this->m_Map,ModifySortedIndex);
        if (gs_pSortedIndex != (int *)0x0) {
          operator_delete__(gs_pSortedIndex);
        }
        gs_pSortedIndex = (int *)0x0;
        if (local_48.list != (CEditorImage **)0x0) {
          operator_delete__(local_48.list);
        }
        break;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->m_Map).m_lImages.num_elements);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::SortImages()
{
	bool Sorted = true;
	for(int i = 1; i < m_Map.m_lImages.size(); i++)
		if(*m_Map.m_lImages[i] < *m_Map.m_lImages[i-1])
		{
			Sorted = false;
			break;
		}

	if(!Sorted)
	{
		array<CEditorImage*> lTemp = array<CEditorImage*>(m_Map.m_lImages);
		gs_pSortedIndex = new int[lTemp.size()];

		std::stable_sort(&m_Map.m_lImages[0], &m_Map.m_lImages[m_Map.m_lImages.size()], CompareImage);

		for(int OldIndex = 0; OldIndex < lTemp.size(); OldIndex++)
			for(int NewIndex = 0; NewIndex < m_Map.m_lImages.size(); NewIndex++)
				if(lTemp[OldIndex] == m_Map.m_lImages[NewIndex])
					gs_pSortedIndex[OldIndex] = NewIndex;

		m_Map.ModifyImageIndex(ModifySortedIndex);

		delete [] gs_pSortedIndex;
		gs_pSortedIndex = 0;
	}
}